

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O2

CService * ip(CService *__return_storage_ptr__,uint32_t i)

{
  CChainParams *pCVar1;
  long in_FS_OFFSET;
  in_addr s;
  in_addr local_34;
  CNetAddr local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_34.s_addr = i;
  CNetAddr::CNetAddr(&local_30,&local_34);
  pCVar1 = Params();
  CService::CService(__return_storage_ptr__,&local_30,pCVar1->nDefaultPort);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_30.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CService ip(uint32_t i)
{
    struct in_addr s;
    s.s_addr = i;
    return CService(CNetAddr(s), Params().GetDefaultPort());
}